

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O0

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTechnique
          (OgreImporter *this,string *techniqueName,stringstream *ss,aiMaterial *material)

{
  bool bVar1;
  __type _Var2;
  Logger *pLVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_00;
  basic_formatter *pbVar4;
  string *passName_00;
  undefined1 local_410 [8];
  string passName;
  allocator<char> local_3c9;
  undefined1 local_3c8 [8];
  string partPass;
  string local_230;
  undefined4 local_20c;
  fpos<__mbstate_t> local_208;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_80;
  undefined1 local_50 [8];
  string linePart;
  aiMaterial *material_local;
  stringstream *ss_local;
  string *techniqueName_local;
  OgreImporter *this_local;
  
  linePart.field_2._8_8_ = material;
  std::__cxx11::string::string((string *)local_50);
  std::operator>>((istream *)ss,(string *)local_50);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)partBlockStart_abi_cxx11_);
  if (bVar1) {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[60]>
              (&local_1f8,
               (char (*) [60])"Invalid material: Technique block start missing near index ");
    local_208 = (fpos<__mbstate_t>)std::istream::tellg();
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1f8,&local_208);
    Formatter::basic_formatter::operator_cast_to_string(&local_80,pbVar4);
    Logger::error(pLVar3,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1f8);
    this_local._7_1_ = false;
    local_20c = 1;
  }
  else {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[13]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&partPass.field_2 + 8),(char (*) [13])" technique \'");
    this_00 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        (partPass.field_2._M_local_buf + 8),techniqueName);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (this_00,(char (*) [2])0xb4d897);
    Formatter::basic_formatter::operator_cast_to_string(&local_230,pbVar4);
    Logger::debug(pLVar3,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&partPass.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"pass",&local_3c9);
    std::allocator<char>::~allocator(&local_3c9);
    while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_50,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)partBlockEnd_abi_cxx11_), bVar1) {
      std::operator>>((istream *)ss,(string *)local_50);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)partComment_abi_cxx11_);
      if (_Var2) {
        SkipLine((string *)((long)&passName.field_2 + 8),ss);
        std::__cxx11::string::~string((string *)(passName.field_2._M_local_buf + 8));
      }
      else {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3c8);
        if (_Var2) {
          SkipLine((string *)local_410,ss);
          passName_00 = Trim((string *)local_410,true);
          ReadPass(this,passName_00,ss,(aiMaterial *)linePart.field_2._8_8_);
          std::__cxx11::string::~string((string *)local_410);
        }
      }
    }
    this_local._7_1_ = true;
    local_20c = 1;
    std::__cxx11::string::~string((string *)local_3c8);
  }
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool OgreImporter::ReadTechnique(const std::string &techniqueName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Technique block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F(" technique '", techniqueName, "'");

    const string partPass  = "pass";

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        /// @todo Techniques have other attributes than just passes.
        if (linePart == partPass)
        {
            string passName = SkipLine(ss);
            ReadPass(Trim(passName), ss, material);
        }
    }
    return true;
}